

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int notation3(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  ENCODING *UNUSED_enc_local;
  char *UNUSED_end_local;
  char *UNUSED_ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  if (tok == 0xf) {
    state_local._4_4_ = 0x11;
  }
  else if (tok == 0x1b) {
    state->handler = declClose;
    state->role_none = 0x11;
    state_local._4_4_ = 0x13;
  }
  else {
    state_local._4_4_ = common(state,tok);
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
notation3(PROLOG_STATE *state,
          int tok,
          const char *UNUSED_P(ptr),
          const char *UNUSED_P(end),
          const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NOTATION_NONE;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    state->role_none = XML_ROLE_NOTATION_NONE;
    return XML_ROLE_NOTATION_SYSTEM_ID;
  }
  return common(state, tok);
}